

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [2],
          uint *params_2,char (*params_3) [2],uint *params_4,char (*params_5) [10],
          StringPtr *params_6,char (*params_7) [2])

{
  String *value;
  char (*pacVar1) [2];
  uint *puVar2;
  char (*value_00) [10];
  StringPtr *value_01;
  ArrayPtr<const_char> *in_stack_ffffffffffffff20;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  CappedArray<char,_14UL> local_98;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_14UL> local_70;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char (*local_38) [2];
  uint *params_local_4;
  char (*params_local_3) [2];
  uint *params_local_2;
  char (*params_local_1) [2];
  String *params_local;
  
  local_38 = params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = (uint *)params;
  params_local_1 = (char (*) [2])this;
  params_local = __return_storage_ptr__;
  value = fwd<kj::String&>((String *)this);
  local_48 = toCharSequence<kj::String&>(value);
  pacVar1 = ::const((char (*) [2])params_local_2);
  local_58 = toCharSequence<char_const(&)[2]>(pacVar1);
  puVar2 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_local_3);
  toCharSequence<unsigned_int>(&local_70,puVar2);
  pacVar1 = ::const((char (*) [2])params_local_4);
  local_80 = toCharSequence<char_const(&)[2]>(pacVar1);
  puVar2 = fwd<unsigned_int>((NoInfer<unsigned_int> *)local_38);
  toCharSequence<unsigned_int>(&local_98,puVar2);
  value_00 = ::const((char (*) [10])params_4);
  local_a8 = toCharSequence<char_const(&)[10]>(value_00);
  value_01 = fwd<kj::StringPtr&>((StringPtr *)params_5);
  local_b8 = toCharSequence<kj::StringPtr&>(value_01);
  pacVar1 = ::const((char (*) [2])params_6);
  local_c8 = toCharSequence<char_const(&)[2]>(pacVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_14UL> *)&local_80,(ArrayPtr<const_char> *)&local_98,
             (CappedArray<char,_14UL> *)&local_a8,&local_b8,&local_c8,in_stack_ffffffffffffff20);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}